

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O0

_Bool duckdb_je_ckh_insert(tsd_t *tsd,ckh_t *ckh,void *key,void *data)

{
  _Bool _Var1;
  _Bool ret;
  ckh_t *in_stack_000000b0;
  tsd_t *in_stack_000000b8;
  
  do {
    _Var1 = ckh_try_insert(ckh,(void **)key,(void **)data);
    if (!_Var1) {
      return false;
    }
    _Var1 = ckh_grow(in_stack_000000b8,in_stack_000000b0);
  } while (!_Var1);
  return true;
}

Assistant:

bool
ckh_insert(tsd_t *tsd, ckh_t *ckh, const void *key, const void *data) {
	bool ret;

	assert(ckh != NULL);
	assert(ckh_search(ckh, key, NULL, NULL));

#ifdef CKH_COUNT
	ckh->ninserts++;
#endif

	while (ckh_try_insert(ckh, &key, &data)) {
		if (ckh_grow(tsd, ckh)) {
			ret = true;
			goto label_return;
		}
	}

	ret = false;
label_return:
	return ret;
}